

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostei_deriv1_generator.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  QAM_ iqam;
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  int *piVar6;
  ostream *poVar7;
  OSTEI_HRR_Algorithm_Base *this;
  runtime_error *prVar8;
  OSTEIDeriv1_Writer *this_00;
  reference pvVar9;
  mapped_type *pmVar10;
  pair<std::_Rb_tree_const_iterator<QAM>,_bool> pVar11;
  exception *ex;
  OSTEIDeriv1_Writer ostei_deriv1_writer;
  OSTEI_VRR_Writer vrr_writer;
  QuartetSet topquartets;
  OSTEI_HRR_Writer hrr_writer;
  QAM amtmp_m;
  QAM amtmp_p;
  int i;
  char *dir [4];
  int missing_center;
  int max;
  set<QAM,_std::less<QAM>,_std::allocator<QAM>_> needed_am;
  Makowski_VRR vrralgo;
  Makowski_HRR hrralgo;
  OSTEI_GeneratorInfo info;
  ofstream ofh;
  ofstream of;
  string argstr;
  size_t iarg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otheropt;
  OptionMap options;
  bool finalamset;
  QAM finalam;
  string hpath;
  string fpath;
  undefined4 in_stack_ffffffffffffef88;
  int in_stack_ffffffffffffef8c;
  int in_stack_ffffffffffffef90;
  int in_stack_ffffffffffffef94;
  int in_stack_ffffffffffffef98;
  int in_stack_ffffffffffffef9c;
  mapped_type start_external;
  OSTEI_GeneratorInfo *in_stack_ffffffffffffefa0;
  value_type *in_stack_ffffffffffffefa8;
  undefined4 in_stack_ffffffffffffefb0;
  undefined4 in_stack_ffffffffffffefb4;
  mapped_type start_external_00;
  size_t *in_stack_ffffffffffffefb8;
  undefined7 in_stack_ffffffffffffefc8;
  undefined1 in_stack_ffffffffffffefcf;
  _Rb_tree_const_iterator<QAM> in_stack_ffffffffffffefd0;
  undefined7 in_stack_ffffffffffffefe8;
  undefined1 in_stack_ffffffffffffefef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeff0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffeff8;
  char *pcVar12;
  size_t *in_stack_fffffffffffff000;
  allocator *paVar13;
  char **in_stack_fffffffffffff028;
  undefined8 in_stack_fffffffffffff030;
  OptionMap *in_stack_fffffffffffff038;
  QuartetSet *in_stack_fffffffffffff0c8;
  undefined4 in_stack_fffffffffffff0d0;
  int in_stack_fffffffffffff0d4;
  OSTEI_VRR_Writer local_ea8 [2];
  undefined4 local_e58;
  undefined4 local_e54;
  OSTEI_HRR_Writer local_e50 [2];
  _Base_ptr local_e00;
  undefined1 local_df8;
  _Base_ptr local_dc0;
  undefined1 local_db8;
  allocator local_d79;
  string local_d78 [32];
  undefined8 local_d58;
  undefined8 uStack_d50;
  int local_d0c;
  char *local_d08 [4];
  int local_ce8;
  int local_ce4;
  OSTEI_VRR_Algorithm_Base local_cb0;
  OSTEI_HRR_Algorithm_Base local_a10;
  OSTEI_GeneratorInfo local_6e8;
  undefined1 local_5b9;
  string local_5b8 [32];
  undefined1 local_598 [519];
  undefined1 local_391;
  string local_390 [32];
  undefined1 local_370 [516];
  int local_16c;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  ulong local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100 [3];
  byte local_b5;
  allocator local_a1;
  string local_a0 [32];
  undefined8 local_80;
  undefined8 uStack_78;
  string local_50 [32];
  string local_30 [44];
  int local_4;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffff030 >> 0x20);
  local_4 = 0;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"",&local_a1);
  QAM::QAM((QAM *)in_stack_ffffffffffffefa0,in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98,
           in_stack_ffffffffffffef94,in_stack_ffffffffffffef90,
           (string *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_b5 = 0;
  DefaultOptions();
  ParseCommonOptions_abi_cxx11_(in_stack_fffffffffffff038,iVar4,in_stack_fffffffffffff028);
  local_108 = 0;
  do {
    uVar1 = local_108;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_100);
    if (sVar5 <= uVar1) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                              (char *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88))
      ;
      if (bVar2) {
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                                (char *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88
                                                ));
        if (bVar2) {
          if ((local_b5 & 1) == 1) {
            poVar7 = std::operator<<((ostream *)&std::cout,"Generating source file ");
            poVar7 = std::operator<<(poVar7,local_30);
            std::operator<<(poVar7,"\n");
            this = (OSTEI_HRR_Algorithm_Base *)
                   std::operator<<((ostream *)&std::cout,"Appending to header file ");
            poVar7 = std::operator<<((ostream *)this,local_50);
            std::operator<<(poVar7,"\n");
            std::ofstream::ofstream(local_370,local_30,_S_out);
            bVar3 = std::ofstream::is_open();
            if ((bVar3 & 1) == 0) {
              local_391 = 1;
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              StringBuilder<char[19],std::__cxx11::string&,char_const(&)[2]>
                        ((char (*) [19])in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
                         (char (*) [2])CONCAT17(in_stack_ffffffffffffefef,in_stack_ffffffffffffefe8)
                        );
              std::runtime_error::runtime_error(prVar8,local_390);
              local_391 = 0;
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::ofstream::ofstream(local_598,local_50,_S_app);
            bVar3 = std::ofstream::is_open();
            if ((bVar3 & 1) == 0) {
              local_5b9 = 1;
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              StringBuilder<char[19],std::__cxx11::string&,char_const(&)[2]>
                        ((char (*) [19])in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff0,
                         (char (*) [2])CONCAT17(in_stack_ffffffffffffefef,in_stack_ffffffffffffefe8)
                        );
              std::runtime_error::runtime_error(prVar8,local_5b8);
              local_5b9 = 0;
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            QAM::QAM((QAM *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                     (QAM *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            OSTEI_GeneratorInfo::GeneratorInfoBase
                      (in_stack_ffffffffffffefa0,
                       (QAM *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
                       in_stack_ffffffffffffef94,
                       (OptionMap *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            QAM::~QAM((QAM *)0x10a7e2);
            Makowski_HRR::Makowski_HRR
                      ((Makowski_HRR *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90)
                       ,(OSTEI_GeneratorInfo *)
                        CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            Makowski_VRR::Makowski_VRR
                      ((Makowski_VRR *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90)
                       ,(OSTEI_GeneratorInfo *)
                        CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
                      ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x10a81d);
            this_00 = (OSTEIDeriv1_Writer *)QAM::begin((QAM *)0x10a82a);
            QAM::end((QAM *)0x10a841);
            piVar6 = std::max_element<int*>
                               ((int *)in_stack_ffffffffffffefa0,
                                (int *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98)
                               );
            local_ce4 = *piVar6;
            piVar6 = QAM::operator[]((QAM *)CONCAT44(in_stack_ffffffffffffef94,
                                                     in_stack_ffffffffffffef90),
                                     in_stack_ffffffffffffef8c);
            if (*piVar6 == local_ce4) {
              local_ce8 = 0;
            }
            else {
              piVar6 = QAM::operator[]((QAM *)CONCAT44(in_stack_ffffffffffffef94,
                                                       in_stack_ffffffffffffef90),
                                       in_stack_ffffffffffffef8c);
              if (*piVar6 == local_ce4) {
                local_ce8 = 1;
              }
              else {
                piVar6 = QAM::operator[]((QAM *)CONCAT44(in_stack_ffffffffffffef94,
                                                         in_stack_ffffffffffffef90),
                                         in_stack_ffffffffffffef8c);
                if (*piVar6 == local_ce4) {
                  local_ce8 = 2;
                }
                else {
                  local_ce8 = 3;
                }
              }
            }
            local_d08[0] = "2a";
            local_d08[1] = "2b";
            local_d08[2] = "2c";
            local_d08[3] = "2d";
            for (local_d0c = 0; local_d0c < 4; local_d0c = local_d0c + 1) {
              if (local_d0c != local_ce8) {
                local_d58 = local_80;
                uStack_d50 = uStack_78;
                pcVar12 = local_d08[local_d0c];
                paVar13 = &local_d79;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_d78,pcVar12,paVar13);
                iqam._M_elems[1] = in_stack_ffffffffffffef9c;
                iqam._M_elems[0] = in_stack_ffffffffffffef98;
                iqam._M_elems._8_8_ = in_stack_ffffffffffffefa0;
                QAM::QAM((QAM *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),iqam,
                         (string *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
                std::__cxx11::string::~string(local_d78);
                std::allocator<char>::~allocator((allocator<char> *)&local_d79);
                QAM::QAM((QAM *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                         (QAM *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
                pvVar9 = std::array<int,_4UL>::operator[]
                                   ((array<int,_4UL> *)
                                    CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                                    CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
                *pvVar9 = *pvVar9 + 1;
                pvVar9 = std::array<int,_4UL>::operator[]
                                   ((array<int,_4UL> *)
                                    CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                                    CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
                *pvVar9 = *pvVar9 + -1;
                pVar11 = std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::insert
                                   ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                                    CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                                    in_stack_ffffffffffffefa8);
                local_dc0 = (_Base_ptr)pVar11.first._M_node;
                local_db8 = pVar11.second;
                QAM::QAM((QAM *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                         (QAM *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
                bVar2 = ValidQAM((QAM *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90
                                                ));
                QAM::~QAM((QAM *)0x10ab6c);
                if (bVar2) {
                  pVar11 = std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::insert
                                     ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                                      CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0),
                                      in_stack_ffffffffffffefa8);
                  in_stack_ffffffffffffefd0 = pVar11.first._M_node;
                  in_stack_ffffffffffffefcf = pVar11.second;
                  local_e00 = in_stack_ffffffffffffefd0._M_node;
                  local_df8 = in_stack_ffffffffffffefcf;
                }
                QAM::~QAM((QAM *)0x10ac5b);
                QAM::~QAM((QAM *)0x10ac68);
              }
            }
            OSTEI_GeneratorInfo::SetDeriv1_MissingCenter(&local_6e8,local_ce8);
            std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::set
                      ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                       CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                       (set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            OSTEI_HRR_Algorithm_Base::Create
                      (this,(set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)poVar7);
            std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
                      ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x10acee);
            local_e54 = 2;
            pmVar10 = std::
                      map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                      ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                                    *)in_stack_ffffffffffffefd0._M_node,
                                   (key_type *)
                                   CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
            start_external_00 = *pmVar10;
            local_e58 = 3;
            pmVar10 = std::
                      map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                      ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                                    *)in_stack_ffffffffffffefd0._M_node,
                                   (key_type *)
                                   CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
            OSTEI_HRR_Writer::OSTEI_HRR_Writer
                      (local_e50,&local_a10,&local_6e8,start_external_00,*pmVar10);
            OSTEI_HRR_Algorithm_Base::TopQuartets
                      ((OSTEI_HRR_Algorithm_Base *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            OSTEI_VRR_Algorithm_Base::Create
                      ((OSTEI_VRR_Algorithm_Base *)
                       CONCAT44(in_stack_fffffffffffff0d4,in_stack_fffffffffffff0d0),
                       in_stack_fffffffffffff0c8);
            poVar7 = (ostream *)
                     std::
                     map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                     ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                                   *)in_stack_ffffffffffffefd0._M_node,
                                  (key_type *)
                                  CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
            start_external = *(mapped_type *)poVar7;
            in_stack_ffffffffffffefa0 =
                 (OSTEI_GeneratorInfo *)
                 std::
                 map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                 ::operator[]((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>
                               *)in_stack_ffffffffffffefd0._M_node,
                              (key_type *)
                              CONCAT17(in_stack_ffffffffffffefcf,in_stack_ffffffffffffefc8));
            OSTEI_VRR_Writer::OSTEI_VRR_Writer
                      (local_ea8,&local_cb0,&local_6e8,start_external,
                       *(int *)&(in_stack_ffffffffffffefa0->super_GeneratorInfoBase).
                                _vptr_GeneratorInfoBase);
            OSTEIDeriv1_Writer::OSTEI_Writer_Base
                      ((OSTEIDeriv1_Writer *)CONCAT44(start_external_00,in_stack_ffffffffffffefb0),
                       poVar7,(ostream *)in_stack_ffffffffffffefa0,
                       (OSTEI_GeneratorInfo *)CONCAT44(start_external,in_stack_ffffffffffffef98),
                       (OSTEI_VRR_Writer *)
                       CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                       (OSTEI_HRR_Writer *)
                       CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
            OSTEIDeriv1_Writer::WriteFile(this_00);
            std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
                      ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x10ae77);
            std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
                      ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x10ae84);
            Makowski_VRR::~Makowski_VRR((Makowski_VRR *)0x10ae91);
            Makowski_HRR::~Makowski_HRR((Makowski_HRR *)0x10ae9e);
            OSTEI_GeneratorInfo::~OSTEI_GeneratorInfo
                      ((OSTEI_GeneratorInfo *)
                       CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90));
            std::ofstream::~ofstream(local_598);
            std::ofstream::~ofstream(local_370);
            local_16c = 0;
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cout,"\n");
            poVar7 = std::operator<<(poVar7,"AM quartet (-q) required");
            std::operator<<(poVar7,"\n\n");
            local_4 = 1;
            local_16c = 1;
          }
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cout,"\n");
          poVar7 = std::operator<<(poVar7,"output header file path (-oh) required");
          std::operator<<(poVar7,"\n\n");
          local_4 = 1;
          local_16c = 1;
        }
      }
      else {
        poVar7 = std::operator<<((ostream *)&std::cout,"\n");
        poVar7 = std::operator<<(poVar7,"output source file path (-o) required");
        std::operator<<(poVar7,"\n\n");
        local_4 = 1;
        local_16c = 1;
      }
      break;
    }
    GetNextArg(in_stack_ffffffffffffefb8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                            (char *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88));
    if (bVar2) {
      GetNextArg(in_stack_ffffffffffffefb8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
      std::__cxx11::string::operator=(local_30,local_148);
      std::__cxx11::string::~string(local_148);
LAB_0010a2c1:
      local_16c = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                              (char *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88))
      ;
      if (bVar2) {
        GetNextArg(in_stack_ffffffffffffefb8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffefb4,in_stack_ffffffffffffefb0));
        std::__cxx11::string::operator=(local_50,local_168);
        std::__cxx11::string::~string(local_168);
        goto LAB_0010a2c1;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                              (char *)CONCAT44(in_stack_ffffffffffffef8c,in_stack_ffffffffffffef88))
      ;
      if (bVar2) {
        iVar4 = GetIArg(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
        piVar6 = QAM::operator[]((QAM *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90
                                                ),in_stack_ffffffffffffef8c);
        *piVar6 = iVar4;
        iVar4 = GetIArg(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
        piVar6 = QAM::operator[]((QAM *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90
                                                ),in_stack_ffffffffffffef8c);
        *piVar6 = iVar4;
        iVar4 = GetIArg(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
        piVar6 = QAM::operator[]((QAM *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90
                                                ),in_stack_ffffffffffffef8c);
        *piVar6 = iVar4;
        in_stack_fffffffffffff0d4 = GetIArg(in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
        in_stack_fffffffffffff0c8 =
             (QuartetSet *)
             QAM::operator[]((QAM *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
                             in_stack_ffffffffffffef8c);
        *(int *)&(in_stack_fffffffffffff0c8->_M_t)._M_impl = in_stack_fffffffffffff0d4;
        local_b5 = 1;
        goto LAB_0010a2c1;
      }
      std::operator<<((ostream *)&std::cout,"\n\n");
      std::operator<<((ostream *)&std::cout,"--------------------------------\n");
      poVar7 = std::operator<<((ostream *)&std::cout,"Unknown argument: ");
      poVar7 = std::operator<<(poVar7,local_128);
      std::operator<<(poVar7,"\n");
      std::operator<<((ostream *)&std::cout,"--------------------------------\n");
      local_4 = 1;
      local_16c = 1;
    }
    std::__cxx11::string::~string(local_128);
  } while (local_16c == 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffefa0);
  std::map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>::~map
            ((map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_> *)
             0x10aeea);
  QAM::~QAM((QAM *)0x10aef7);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (local_16c == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc, char ** argv)
{
    try {


    // other stuff
    std::string fpath;
    std::string hpath;
    QAM finalam{0,0,0,0};

    bool finalamset = false;

    // parse command line
    OptionMap options = DefaultOptions();
    std::vector<std::string> otheropt = ParseCommonOptions(options, argc, argv);

    // parse specific options
    size_t iarg = 0;
    while(iarg < otheropt.size())
    {
        std::string argstr(GetNextArg(iarg, otheropt));
        if(argstr == "-o")
            fpath = GetNextArg(iarg, otheropt);
        else if(argstr == "-oh")
            hpath = GetNextArg(iarg, otheropt);
        else if(argstr == "-q")
        {
            finalam[0] = GetIArg(iarg, otheropt);   
            finalam[1] = GetIArg(iarg, otheropt);   
            finalam[2] = GetIArg(iarg, otheropt);   
            finalam[3] = GetIArg(iarg, otheropt);   
            finalamset = true;
        }
        else
        {
            std::cout << "\n\n";
            std::cout << "--------------------------------\n";
            std::cout << "Unknown argument: " << argstr << "\n";
            std::cout << "--------------------------------\n";
            return 1; 
        } 
    }


    // check for required options
    CMDLINE_ASSERT( fpath != "", "output source file path (-o) required" )
    CMDLINE_ASSERT( hpath != "", "output header file path (-oh) required" )
    CMDLINE_ASSERT( finalamset == true, "AM quartet (-q) required" )


    // open the output file
    // actually create
    std::cout << "Generating source file " << fpath << "\n";
    std::cout << "Appending to header file " << hpath << "\n";

    std::ofstream of(fpath);
    if(!of.is_open())
        throw std::runtime_error(StringBuilder("Cannot open file: ", fpath, "\n"));

    std::ofstream ofh(hpath, std::ofstream::app);
    if(!ofh.is_open())
        throw std::runtime_error(StringBuilder("Cannot open file: ", hpath, "\n"));
    

    // Information for this OSTEI
    OSTEI_GeneratorInfo info(finalam, 1, options);


    //////////////////////////////////////////////////////////////
    //! \todo Are there special permutations for derivatives?
    //////////////////////////////////////////////////////////////

    // algorithms used
    Makowski_HRR hrralgo(info);
    Makowski_VRR vrralgo(info);

    // Working backwards, I need:
    // 1.) HRR Steps
    //     We need the different increments, decrements for derivatives
    std::set<QAM> needed_am;

    // We only need to do three centers. The fourth is free
    // Find which one to skip
    int max = *(std::max_element(finalam.begin(), finalam.end()));
    
    int missing_center;
    if(finalam[0] == max)
        missing_center = 0;
    else if(finalam[1] == max)
        missing_center = 1;
    else if(finalam[2] == max)
        missing_center = 2;
    else
        missing_center = 3;
    
    const char * dir[4] = {"2a", "2b", "2c", "2d"};
    for(int i = 0; i < 4; i++)
    {
        if(i == missing_center)
            continue;

        QAM amtmp_p(finalam.qam, dir[i]);
        QAM amtmp_m(finalam);
        amtmp_p.qam[i]++;
        amtmp_m.qam[i]--;

        needed_am.insert(amtmp_p);
        if(ValidQAM(amtmp_m))
            needed_am.insert(amtmp_m);
    }

    info.SetDeriv1_MissingCenter(missing_center);

    hrralgo.Create(needed_am);
    OSTEI_HRR_Writer hrr_writer(hrralgo, info,
                                options[Option::ExternalHRR],
                                options[Option::GeneralHRR]);

    QuartetSet topquartets = hrralgo.TopQuartets();

    // 2.) VRR Steps
    vrralgo.Create(topquartets);
    OSTEI_VRR_Writer vrr_writer(vrralgo, info,
                                options[Option::ExternalVRR],
                                options[Option::GeneralVRR]);


    // Create the OSTEI_Writer and write the file
    OSTEIDeriv1_Writer ostei_deriv1_writer(of, ofh, info, vrr_writer, hrr_writer);
    ostei_deriv1_writer.WriteFile();



    }
    catch(std::exception & ex)
    {
        std::cout << "\n\n";
        std::cout << "Caught exception\n";
        std::cout << "What = " << ex.what() << "\n\n";
        return 1;
    }
    return 0;
}